

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O2

t_float glist_pixelstoy(_glist *x,t_float ypix)

{
  int iVar1;
  _glist *glist;
  float fVar2;
  float fVar3;
  int y2;
  int x2;
  int y1;
  int x1;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  if ((*(uint *)&x->field_0xe8 >> 8 & 1) == 0) {
    fVar3 = x->gl_y1;
    fVar2 = x->gl_y2 - fVar3;
    iVar1 = x->gl_zoom;
  }
  else {
    if ((*(uint *)&x->field_0xe8 & 1) == 0) {
      glist = x->gl_owner;
      if (glist == (_glist *)0x0) {
        bug("glist_pixelstox");
        glist = x->gl_owner;
      }
      graph_graphrect((t_gobj *)x,glist,&local_1c,&local_20,&local_24,&local_28);
      return ((ypix - (float)local_20) * (x->gl_y2 - x->gl_y1)) / (float)(local_28 - local_20) +
             x->gl_y1;
    }
    fVar3 = x->gl_y1;
    iVar1 = x->gl_screeny2 - x->gl_screeny1;
    fVar2 = x->gl_y2 - fVar3;
  }
  return (fVar2 * ypix) / (float)iVar1 + fVar3;
}

Assistant:

t_float glist_pixelstoy(t_glist *x, t_float ypix)
{
    if (!x->gl_isgraph)
        return (x->gl_y1 + (x->gl_y2 - x->gl_y1) * ypix / x->gl_zoom);
    else if (x->gl_isgraph && x->gl_havewindow)
        return (x->gl_y1 + (x->gl_y2 - x->gl_y1) *
                (ypix) / (x->gl_screeny2 - x->gl_screeny1));
    else
    {
        int x1, y1, x2, y2;
        if (!x->gl_owner)
            bug("glist_pixelstox");
        graph_graphrect(&x->gl_gobj, x->gl_owner, &x1, &y1, &x2, &y2);
        return (x->gl_y1 + (x->gl_y2 - x->gl_y1) *
            (ypix - y1) / (y2 - y1));
    }
}